

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.h
# Opt level: O0

void __thiscall jbcoin::Serializer::Serializer(Serializer *this,int n)

{
  int n_local;
  Serializer *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&this->mData,(long)n);
  return;
}

Assistant:

explicit
    Serializer (int n = 256)
    {
        mData.reserve (n);
    }